

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.h
# Opt level: O0

json __thiscall
JsonProtocol::SerializeArray<Stack>(JsonProtocol *this,vector<Stack,_std::allocator<Stack>_> *objs)

{
  vector<Stack,_std::allocator<Stack>_> *this_00;
  bool bVar1;
  json_value extraout_RDX;
  json jVar2;
  initializer_list_t init;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  reference local_50;
  Stack *obj;
  iterator __end0;
  iterator __begin0;
  vector<Stack,_std::allocator<Stack>_> *__range2;
  undefined1 local_19;
  vector<Stack,_std::allocator<Stack>_> *local_18;
  vector<Stack,_std::allocator<Stack>_> *objs_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *arr;
  
  local_19 = 0;
  local_18 = objs;
  objs_local = (vector<Stack,_std::allocator<Stack>_> *)this;
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&__range2);
  init._M_len = (size_type)__range2;
  init._M_array = (iterator)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::array(init);
  this_00 = local_18;
  __end0 = std::vector<Stack,_std::allocator<Stack>_>::begin(local_18);
  obj = (Stack *)std::vector<Stack,_std::allocator<Stack>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Stack_*,_std::vector<Stack,_std::allocator<Stack>_>_>
                                     *)&obj), bVar1) {
    local_50 = __gnu_cxx::__normal_iterator<Stack_*,_std::vector<Stack,_std::allocator<Stack>_>_>::
               operator*(&__end0);
    (*(local_50->super_JsonProtocol)._vptr_JsonProtocol[2])(&local_60);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)this,&local_60);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_60);
    __gnu_cxx::__normal_iterator<Stack_*,_std::vector<Stack,_std::allocator<Stack>_>_>::operator++
              (&__end0);
  }
  jVar2.m_value.object = extraout_RDX.object;
  jVar2._0_8_ = this;
  return jVar2;
}

Assistant:

static nlohmann::json SerializeArray(std::vector<T> &objs) {
		auto arr = nlohmann::json::array();
		for (auto &obj: objs) {
			arr.push_back(obj.Serialize());
		}
		return arr;
	}